

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  ushort uVar2;
  lha *lha;
  char cVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  uchar *p;
  char *pcVar10;
  size_t sVar11;
  void *pvVar12;
  ushort *pp;
  short *pp_00;
  byte *pbVar13;
  int64_t iVar14;
  ulong uVar15;
  wchar_t *pwVar16;
  size_t sVar17;
  mode_t mVar18;
  long lVar19;
  size_t sVar20;
  char *pcVar21;
  ulong uVar22;
  byte bVar23;
  void *pvVar24;
  bool bVar25;
  size_t local_f8;
  archive_wstring local_e8;
  archive_wstring local_c8;
  int64_t *local_a8;
  wchar_t *conv_buffer_p;
  size_t extdsize;
  size_t sStack_90;
  size_t local_88;
  char *pcStack_80;
  size_t local_78;
  size_t sStack_70;
  archive_wstring local_68;
  char *pcStack_50;
  size_t local_48;
  size_t sStack_40;
  
  if (lha_crc16_init_crc16init == '\0') {
    lha_crc16_init_crc16init = '\x01';
    for (uVar22 = 0; uVar22 != 0x100; uVar22 = uVar22 + 1) {
      uVar15 = uVar22 & 0xffffffff;
      for (iVar5 = -8; iVar5 != 0; iVar5 = iVar5 + 1) {
        uVar7 = 0;
        if ((uVar15 & 1) != 0) {
          uVar7 = 0xa001;
        }
        uVar15 = (ulong)(uVar7 ^ (uint)(uVar15 >> 1) & 0x7fff);
      }
      crc16tbl[0][uVar22] = (uint16_t)uVar15;
    }
    for (lVar19 = -0x100; lVar19 != 0; lVar19 = lVar19 + 1) {
      *(uint16_t *)((long)&archive_read_format_tar_read_header::default_inode + lVar19 * 2) =
           crc16tbl[1][lVar19] >> 8 ^ crc16tbl[0][(byte)crc16tbl[1][lVar19]];
    }
  }
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar10 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar10 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar10 == '\0') {
      return L'\x01';
    }
LAB_0011f9a2:
    truncated_error(a);
    return L'\xffffffe2';
  }
  if (lha->found_first_header == '\0') {
    cVar3 = *pcVar10;
    if (cVar3 != 'M') goto LAB_0011f8d5;
    if (pcVar10[1] != 'Z') goto LAB_0011f8d1;
    local_f8 = 0x1000;
    while( true ) {
      while (pvVar12 = __archive_read_ahead(a,local_f8,(ssize_t *)&extdsize), pvVar12 == (void *)0x0
            ) {
        bVar25 = local_f8 < 0x32;
        local_f8 = local_f8 >> 1;
        if (bVar25) goto LAB_0011ffdf;
      }
      if ((long)extdsize < 0x16) break;
      uVar22 = extdsize + (long)pvVar12;
      for (pvVar24 = pvVar12; (long)pvVar24 + 0x16U < uVar22;
          pvVar24 = (void *)((long)pvVar24 + sVar11)) {
        sVar11 = lha_check_header_format(pvVar24);
        if (sVar11 == 0) {
          __archive_read_consume(a,(long)pvVar24 - (long)pvVar12);
          pcVar10 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
          if (pcVar10 != (char *)0x0) goto LAB_0011f8d1;
          goto LAB_0011f9a2;
        }
      }
      __archive_read_consume(a,(long)pvVar24 - (long)pvVar12);
    }
LAB_0011ffdf:
    pcVar10 = "Couldn\'t find out LHa header";
LAB_0011ffe6:
    archive_set_error(&a->archive,0x54,pcVar10);
  }
  else {
LAB_0011f8d1:
    cVar3 = *pcVar10;
LAB_0011f8d5:
    if (cVar3 == '\0') {
      return L'\x01';
    }
    sVar11 = lha_check_header_format(pcVar10);
    if (sVar11 != 0) {
      archive_set_error(&a->archive,0x54,"Bad LHa file");
      return L'\xffffffe2';
    }
    lha->found_first_header = '\x01';
    lha->header_size = 0;
    lha->level = pcVar10[0x14];
    pcVar21 = lha->method;
    lha->method[0] = pcVar10[3];
    lha->method[1] = pcVar10[4];
    lha->method[2] = pcVar10[5];
    iVar5 = bcmp(pcVar21,"lhd",3);
    lha->directory = iVar5 == 0;
    iVar6 = bcmp(pcVar21,"lh0",3);
    if (iVar6 == 0) {
      bVar25 = false;
    }
    else {
      iVar6 = bcmp(pcVar21,"lz4",3);
      bVar25 = iVar6 != 0;
    }
    lha->birthtime = 0;
    lha->birthtime_tv_nsec = 0;
    lha->mtime = 0;
    lha->mtime_tv_nsec = 0;
    lha->atime = 0;
    lha->atime_tv_nsec = 0;
    lha->entry_is_compressed = bVar25;
    mVar18 = 0x1b6;
    if (iVar5 == 0) {
      mVar18 = 0x1ff;
    }
    lha->compsize = 0;
    lha->origsize = 0;
    lha->setflag = 0;
    lha->mode = mVar18;
    (lha->dirname).length = 0;
    (lha->filename).length = 0;
    lha->dos_attr = '\0';
    lha->uid = 0;
    lha->gid = 0;
    lha->sconv_dir = lha->opt_sconv;
    lha->sconv_fname = lha->opt_sconv;
    if (3 < (byte)pcVar10[0x14]) {
      archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
      return L'\xffffffe2';
    }
    switch(pcVar10[0x14]) {
    case '\0':
      pbVar13 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      if (pbVar13 == (byte *)0x0) goto LAB_001200a9;
      lha->header_size = (ulong)*pbVar13 + 2;
      bVar1 = pbVar13[1];
      lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
      lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
      iVar14 = dos_to_unix(*(uint32_t *)(pbVar13 + 0xf));
      lha->mtime = iVar14;
      bVar23 = pbVar13[0x15];
      uVar22 = (ulong)bVar23;
      iVar5 = ((int)lha->header_size - (uint)bVar23) + -0x18;
      if (iVar5 != -2 && (iVar5 < 0 || 0xdd < bVar23)) {
        pcVar10 = "Invalid LHa header";
        goto LAB_0011ffe6;
      }
      pvVar12 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
      if (pvVar12 == (void *)0x0) {
        truncated_error(a);
        return L'\xffffffe2';
      }
      (lha->filename).length = 0;
      archive_strncat(&lha->filename,(void *)((long)pvVar12 + 0x16),uVar22);
      if (-1 < iVar5) {
        lha->crc = *(uint16_t *)((long)pvVar12 + 0x16 + uVar22);
        *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      }
      bVar23 = 0;
      for (sVar11 = 2; lha->header_size != sVar11; sVar11 = sVar11 + 1) {
        bVar23 = bVar23 + *(char *)((long)pvVar12 + sVar11);
      }
      if (((0 < iVar5) && (*(char *)((long)pvVar12 + uVar22 + 0x18) == 'U')) && (iVar5 == 0xc)) {
        lha->mtime = (ulong)*(uint *)((long)pvVar12 + uVar22 + 0x1a);
        lha->mode = (uint)*(ushort *)((long)pvVar12 + uVar22 + 0x1e);
        lha->uid = (ulong)*(ushort *)((long)pvVar12 + uVar22 + 0x20);
        lha->gid = (ulong)*(ushort *)((long)pvVar12 + uVar22 + 0x22);
        *(byte *)&lha->setflag = (byte)lha->setflag | 4;
      }
      __archive_read_consume(a,lha->header_size);
      wVar8 = L'\0';
      if (bVar23 != bVar1) {
        archive_set_error(&a->archive,-1,"LHa header sum error");
        return L'\xffffffe2';
      }
      goto LAB_0012001d;
    case '\x01':
      pbVar13 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
      if (pbVar13 == (byte *)0x0) {
LAB_0011fe86:
        truncated_error(a);
        goto LAB_0011fe8e;
      }
      lha->header_size = (ulong)*pbVar13 + 2;
      bVar1 = pbVar13[1];
      lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
      lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
      iVar14 = dos_to_unix(*(uint32_t *)(pbVar13 + 0xf));
      lha->mtime = iVar14;
      bVar23 = pbVar13[0x15];
      uVar22 = (ulong)bVar23;
      if ((bVar23 < 0xe7) && ((int)(uint)bVar23 <= (int)lha->header_size + -0x1b)) {
        pvVar12 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
        if (pvVar12 != (void *)0x0) {
          sVar11 = 2;
          pvVar24 = (void *)((long)pvVar12 + 0x16);
          uVar15 = 0;
LAB_0011fd91:
          if (uVar22 != uVar15) goto code_r0x0011fd9a;
          (lha->filename).length = 0;
          local_a8 = &lha->compsize;
          archive_strncat(&lha->filename,pvVar24,uVar22);
          lha->crc = *(uint16_t *)((long)pvVar24 + uVar22);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          bVar23 = 0;
          for (; lha->header_size != sVar11; sVar11 = sVar11 + 1) {
            bVar23 = bVar23 + *(char *)((long)pvVar12 + sVar11);
          }
          __archive_read_consume(a,lha->header_size - 2);
          wVar8 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,&extdsize);
          if (L'\xffffffeb' < wVar8) {
            lVar19 = (*local_a8 - extdsize) + 2;
            *local_a8 = lVar19;
            if (lVar19 < 0) goto LAB_0011fda5;
            if (bVar23 == bVar1) {
              wVar8 = wVar8 & wVar8 >> 0x1f;
              break;
            }
            pcVar21 = "LHa header sum error";
            iVar5 = -1;
            goto LAB_0011fdae;
          }
          break;
        }
        truncated_error(a);
      }
      else {
LAB_0011fda5:
        pcVar21 = "Invalid LHa header";
        iVar5 = 0x54;
LAB_0011fdae:
        archive_set_error(&a->archive,iVar5,pcVar21);
      }
      wVar8 = L'\xffffffe2';
      break;
    case '\x02':
      pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      if (pp == (ushort *)0x0) goto LAB_0011fe86;
      uVar2 = *pp;
      lha->header_size = (ulong)uVar2;
      lha->compsize = (ulong)*(uint *)((long)pp + 7);
      lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
      lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
      uVar4 = *(uint16_t *)((long)pp + 0x15);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      lha->crc = uVar4;
      if ((ulong)uVar2 < 0x18) {
        pcVar21 = "Invalid LHa header size";
        goto LAB_0011fcf1;
      }
      uVar4 = lha_crc16(0,pp,0x18);
      local_e8.s = (wchar_t *)CONCAT62(local_e8.s._2_6_,uVar4);
      __archive_read_consume(a,0x18);
      wVar8 = lha_read_file_extended_header
                        (a,lha,(uint16_t *)&local_e8,L'\x02',lha->header_size - 0x18,&extdsize);
      if (L'\xffffffeb' < wVar8) {
        uVar7 = ((int)lha->header_size - (int)extdsize) - 0x18;
        if (0 < (int)uVar7) {
          uVar22 = (ulong)uVar7;
          pvVar12 = __archive_read_ahead(a,uVar22,(ssize_t *)0x0);
          if (pvVar12 == (void *)0x0) goto LAB_0011fe86;
          uVar4 = lha_crc16((uint16_t)local_e8.s,pvVar12,uVar22);
          local_e8.s = (wchar_t *)CONCAT62(local_e8.s._2_6_,uVar4);
          __archive_read_consume(a,uVar22);
        }
        if ((uint16_t)local_e8.s != lha->header_crc) goto LAB_0011ffd3;
      }
      break;
    case '\x03':
      pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
      if (pp_00 == (short *)0x0) goto LAB_0011fe86;
      if (*pp_00 == 4) {
        uVar7 = *(uint *)(pp_00 + 0xc);
        lha->header_size = (ulong)uVar7;
        lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
        lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
        lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
        uVar4 = *(uint16_t *)((long)pp_00 + 0x15);
        *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        lha->crc = uVar4;
        if (0x1f < (ulong)uVar7) {
          uVar4 = lha_crc16(0,pp_00,0x1c);
          local_e8.s = (wchar_t *)CONCAT62(local_e8.s._2_6_,uVar4);
          __archive_read_consume(a,0x1c);
          wVar8 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)&local_e8,L'\x04',lha->header_size - 0x1c,&extdsize);
          if ((wVar8 < L'\xffffffec') || ((uint16_t)local_e8.s == lha->header_crc)) break;
LAB_0011ffd3:
          pcVar21 = "LHa header CRC error";
          goto LAB_0011fcf1;
        }
      }
      pcVar21 = "Invalid LHa header";
LAB_0011fcf1:
      archive_set_error(&a->archive,0x54,pcVar21);
LAB_0011fe8e:
      wVar8 = L'\xffffffe2';
    }
    if (wVar8 < L'\xffffffec') {
      return wVar8;
    }
LAB_0012001d:
    if ((lha->directory == '\0') && ((lha->filename).length == 0)) {
LAB_001200a9:
      truncated_error(a);
      return L'\xffffffe2';
    }
    local_c8.buffer_length = 0;
    local_e8.buffer_length = 0;
    local_c8.s = (wchar_t *)0x0;
    local_c8.length = 0;
    local_e8.s = (wchar_t *)0x0;
    local_e8.length = 0;
    extdsize = 0;
    sStack_90 = 0;
    local_88 = 0;
    pcStack_80 = (char *)0x0;
    local_78 = 0;
    sStack_70 = 0;
    local_68.s = (wchar_t *)0x0;
    local_68.length = 0;
    local_68.buffer_length = 0;
    pcStack_50 = (char *)0x0;
    local_48 = 0;
    sStack_40 = 0;
    wVar9 = archive_mstring_copy_mbs_len_l
                      ((archive_mstring *)&extdsize,(lha->dirname).s,(lha->dirname).length,
                       lha->sconv_dir);
    if (wVar9 == L'\0') {
      wVar9 = archive_mstring_get_wcs(&a->archive,(archive_mstring *)&extdsize,&conv_buffer_p);
      if (wVar9 == L'\0') {
        local_c8.length = 0;
        archive_wstring_concat(&local_c8,&local_68);
        sStack_90 = 0;
        local_48 = 0;
        local_78 = 0;
        local_68.length = 0;
        wVar9 = archive_mstring_copy_mbs_len_l
                          ((archive_mstring *)&extdsize,(lha->filename).s,(lha->filename).length,
                           lha->sconv_fname);
        if (wVar9 != L'\0') {
          pcVar10 = archive_string_conversion_charset_name(lha->sconv_fname);
          archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",
                            pcVar10);
LAB_00120239:
          archive_mstring_clean((archive_mstring *)&extdsize);
          archive_wstring_free(&local_c8);
          archive_wstring_free(&local_e8);
          return L'\xffffffe2';
        }
        wVar9 = archive_mstring_get_wcs(&a->archive,(archive_mstring *)&extdsize,&conv_buffer_p);
        if (wVar9 != L'\0') goto LAB_00120239;
        archive_wstring_concat(&local_c8,&local_68);
        archive_mstring_clean((archive_mstring *)&extdsize);
        if ((lha->mode & 0xf000) == 0xa000) {
          pwVar16 = wcschr(local_c8.s,L'|');
          if (pwVar16 == (wchar_t *)0x0) {
            archive_set_error(&a->archive,0x54,"Unknown symlink-name");
            archive_wstring_free(&local_c8);
            archive_wstring_free(&local_e8);
            return L'\xffffffe7';
          }
          sVar17 = wcslen(pwVar16 + 1);
          local_e8.length = 0;
          archive_wstrncat(&local_e8,pwVar16 + 1,sVar17);
          *pwVar16 = L'\0';
          local_c8.length = wcslen(local_c8.s);
        }
        else {
          lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
        }
        if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
          *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
        }
        archive_entry_copy_pathname_w(entry,local_c8.s);
        archive_wstring_free(&local_c8);
        if (local_e8.length == 0) {
          archive_entry_set_symlink(entry,(char *)0x0);
        }
        else {
          archive_entry_copy_symlink_w(entry,local_e8.s);
        }
        archive_wstring_free(&local_e8);
        if (pcVar10[0x14] == '\0') {
          pwVar16 = archive_entry_pathname_w(entry);
          if (pwVar16 != (wchar_t *)0x0) {
            (lha->ws).length = 0;
            sVar17 = wcslen(pwVar16);
            archive_wstrncat(&lha->ws,pwVar16,sVar17);
            pwVar16 = (lha->ws).s;
            sVar11 = (lha->ws).length;
            for (sVar20 = 0; sVar11 != sVar20; sVar20 = sVar20 + 1) {
              if (pwVar16[sVar20] == L'\\') {
                pwVar16[sVar20] = L'/';
              }
            }
            archive_entry_copy_pathname_w(entry,pwVar16);
          }
          pwVar16 = archive_entry_symlink_w(entry);
          if (pwVar16 != (wchar_t *)0x0) {
            (lha->ws).length = 0;
            sVar17 = wcslen(pwVar16);
            archive_wstrncat(&lha->ws,pwVar16,sVar17);
            pwVar16 = (lha->ws).s;
            sVar11 = (lha->ws).length;
            for (sVar20 = 0; sVar11 != sVar20; sVar20 = sVar20 + 1) {
              if (pwVar16[sVar20] == L'\\') {
                pwVar16[sVar20] = L'/';
              }
            }
            archive_entry_copy_symlink_w(entry,pwVar16);
          }
        }
        archive_entry_set_mode(entry,lha->mode);
        archive_entry_set_uid(entry,lha->uid);
        archive_entry_set_gid(entry,lha->gid);
        if ((lha->uname).length != 0) {
          archive_entry_set_uname(entry,(lha->uname).s);
        }
        if ((lha->gname).length != 0) {
          archive_entry_set_gname(entry,(lha->gname).s);
        }
        if ((lha->setflag & 1) == 0) {
          archive_entry_unset_birthtime(entry);
          archive_entry_unset_ctime(entry);
        }
        else {
          archive_entry_set_birthtime(entry,lha->birthtime,(ulong)lha->birthtime_tv_nsec);
          archive_entry_set_ctime(entry,lha->birthtime,(ulong)lha->birthtime_tv_nsec);
        }
        archive_entry_set_mtime(entry,lha->mtime,(ulong)lha->mtime_tv_nsec);
        if ((lha->setflag & 2) == 0) {
          archive_entry_unset_atime(entry);
        }
        else {
          archive_entry_set_atime(entry,lha->atime,(ulong)lha->atime_tv_nsec);
        }
        if ((lha->directory == '\0') &&
           (pcVar10 = archive_entry_symlink(entry), pcVar10 == (char *)0x0)) {
          archive_entry_set_size(entry,lha->origsize);
        }
        else {
          archive_entry_unset_size(entry);
        }
        lVar19 = lha->compsize;
        lha->entry_bytes_remaining = lVar19;
        if (-1 < lVar19) {
          lha->entry_offset = 0;
          lha->entry_crc_calculated = 0;
          if ((lVar19 == 0) || (lha->directory != '\0')) {
            lha->end_of_entry = '\x01';
          }
          snprintf(lha->format_name,0x40,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
                   (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
          (a->archive).archive_format_name = lha->format_name;
          return wVar8;
        }
        pcVar10 = "Invalid LHa entry size";
        goto LAB_0011ffe6;
      }
    }
    else {
      pcVar10 = archive_string_conversion_charset_name(lha->sconv_dir);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",pcVar10)
      ;
    }
    archive_mstring_clean((archive_mstring *)&extdsize);
    archive_wstring_free(&local_c8);
    archive_wstring_free(&local_e8);
  }
  return L'\xffffffe2';
code_r0x0011fd9a:
  pcVar21 = (char *)((long)pvVar24 + uVar15);
  uVar15 = uVar15 + 1;
  if (*pcVar21 == -1) goto LAB_0011fda5;
  goto LAB_0011fd91;
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_wstring linkname;
	struct archive_wstring pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	struct archive_mstring conv_buffer;
	const wchar_t *conv_buffer_p;

	lha_crc16_init();

	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL) {
		lha->sconv_dir = lha->opt_sconv;
		lha->sconv_fname = lha->opt_sconv;
	} else {
		lha->sconv_dir = NULL;
		lha->sconv_fname = NULL;
	}

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename, after converting to Unicode.
	 * This is because codepages might differ between dirname and filename.
	*/
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_init(&conv_buffer.aes_mbs);
	archive_string_init(&conv_buffer.aes_mbs_in_locale);
	archive_string_init(&conv_buffer.aes_utf8);
	archive_string_init(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->dirname.s, lha->dirname.length, lha->sconv_dir)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_dir));
		err = ARCHIVE_FATAL;
	} else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_copy(&pathname, &conv_buffer.aes_wcs);

	archive_string_empty(&conv_buffer.aes_mbs);
	archive_string_empty(&conv_buffer.aes_mbs_in_locale);
	archive_string_empty(&conv_buffer.aes_utf8);
	archive_wstring_empty(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->filename.s, lha->filename.length, lha->sconv_fname)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_fname));
		err = ARCHIVE_FATAL;
	}
	else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_concat(&pathname, &conv_buffer.aes_wcs);
	archive_mstring_clean(&conv_buffer);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_wstring_free(&pathname);
			archive_wstring_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	archive_entry_copy_pathname_w(entry, pathname.s);
	archive_wstring_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		archive_entry_copy_symlink_w(entry, linkname.s);
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_wstring_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	if (lha->entry_bytes_remaining < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa entry size");
		return (ARCHIVE_FATAL);
	}
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	snprintf(lha->format_name, sizeof(lha->format_name), "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}